

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

string * __thiscall
Parser::bracketOperatorFix(string *__return_storage_ptr__,Parser *this,string *data)

{
  char cVar1;
  bool bVar2;
  Instruction IVar3;
  mapped_type *pmVar4;
  string *this_00;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  uint currentLayer;
  string *local_90;
  allocator local_81;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bracketOperators;
  string newOperator;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  currentLayer = 0;
  bracketOperators._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bracketOperators._M_t._M_impl.super__Rb_tree_header._M_header;
  bracketOperators._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bracketOperators._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar7 = false;
  uVar6 = 0;
  local_90 = __return_storage_ptr__;
  bracketOperators._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bracketOperators._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    iVar5 = (int)uVar6;
    if (data->_M_string_length <= uVar6) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&bracketOperators._M_t);
      return local_90;
    }
    cVar1 = (data->_M_dataplus)._M_p[uVar6];
    bVar7 = (bool)(bVar7 ^ cVar1 == '\"');
    if (bVar7) {
LAB_0010b4b6:
      std::__cxx11::string::push_back((char)local_90);
    }
    else if ((cVar1 == ',') || (cVar1 == ')')) {
      pmVar4 = std::
               map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&bracketOperators,&currentLayer);
      if (pmVar4->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)local_90);
        std::
        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&bracketOperators,&currentLayer);
        std::__cxx11::string::append((string *)local_90);
      }
      std::__cxx11::string::push_back((char)local_90);
      if ((data->_M_dataplus)._M_p[uVar6] == ')') {
        currentLayer = currentLayer - 1;
      }
      else {
        pmVar4 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&bracketOperators,&currentLayer);
        pmVar4->_M_string_length = 0;
        *(pmVar4->_M_dataplus)._M_p = '\0';
      }
    }
    else {
      if (cVar1 == '(') {
        currentLayer = currentLayer + 1;
        pmVar4 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&bracketOperators,&currentLayer);
        std::__cxx11::string::assign((char *)pmVar4);
        goto LAB_0010b4b6;
      }
      std::__cxx11::string::substr((ulong)&newOperator,(ulong)data);
      IVar3 = stringToInstruction(&newOperator);
      std::__cxx11::string::~string((string *)&newOperator);
      if (IVar3 == NONE) {
        std::__cxx11::string::substr((ulong)&newOperator,(ulong)data);
        IVar3 = stringToInstruction(&newOperator);
        std::__cxx11::string::~string((string *)&newOperator);
        if (IVar3 == NONE) goto LAB_0010b4b6;
        std::__cxx11::string::substr((ulong)&newOperator,(ulong)data);
        pmVar4 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&bracketOperators,&currentLayer);
        if (pmVar4->_M_string_length != 0) {
          pmVar4 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&bracketOperators,&currentLayer);
          bVar2 = std::operator!=(&newOperator,pmVar4);
          if (bVar2) {
            this_00 = (string *)__cxa_allocate_exception(0x20);
            std::__cxx11::string::string
                      (this_00,"Please only use one operator per bracket at the moment",&local_81);
            __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
        }
        pmVar4 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&bracketOperators,&currentLayer);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        std::__cxx11::string::erase
                  ((ulong)local_90,local_90->_M_string_length - newOperator._M_string_length);
        std::__cxx11::string::~string((string *)&newOperator);
      }
      else {
        std::__cxx11::string::substr((ulong)&newOperator,(ulong)data);
        pmVar4 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&bracketOperators,&currentLayer);
        std::__cxx11::string::operator=((string *)pmVar4,(string *)&newOperator);
        std::__cxx11::string::~string((string *)&newOperator);
        std::__cxx11::string::erase((ulong)local_90,local_90->_M_string_length - 1);
        iVar5 = iVar5 + 1;
      }
    }
    uVar6 = (ulong)(iVar5 + 1);
  } while( true );
}

Assistant:

std::string Parser::bracketOperatorFix(const std::string &data)
{
    //Convert things like "((1 + 2) + (3 * 4))" to "((1 2 +) (3 4 *) +)"

    std::string returnValue; //Store what the function will return as it's generated
    unsigned int currentLayer = 0; //To keep track of the current bracket layer
    std::map<unsigned int, std::string> bracketOperators; //Keep track of each bracket layer's operator. Map to keep track of multiple layers of brackets. map<LAYER, OPERATOR>
    bool isQuoteOpen = false;

    //Find operators and data
    for(unsigned int a = 0; a < data.size(); a++)
    {
        //If quotation marks
        if(data[a] == '"')
        {
            isQuoteOpen = !isQuoteOpen;
        }

        //If new bracket, update bracket layer and set the layer's default operator (+)
        if(!isQuoteOpen && data[a] == '(')
        {
            currentLayer++;
            bracketOperators[currentLayer] = "";
            returnValue += data[a];
        }

        //If we're exiting a bracket, update the layer and insert a space followed by this layer's operator
        else if(!isQuoteOpen && (data[a] == ')' || data[a] == ','))
        {
            if(!bracketOperators[currentLayer].empty()) //Only add operator to the end if there is one
            {
                returnValue += ' ';
                returnValue += bracketOperators[currentLayer];
            }
            returnValue += data[a];
            if(data[a] == ')')
                currentLayer--;
            else
                bracketOperators[currentLayer].clear();
        }

        //Else if dual-character operator. Temporary fix.
        else if(!isQuoteOpen && a != data.size() && stringToInstruction(data.substr(a, 2)) != Instruction::NONE)
        {
            bracketOperators[currentLayer] = data.substr(a, 2);
            returnValue.erase(returnValue.size()-1, 1);
            a++;
        }

        //Else if a single-character operator, don't add the operator to the return value and store this layer's operator
        else if(!isQuoteOpen && stringToInstruction(data.substr(a, 1)) != Instruction::NONE)
        {
            std::string newOperator = data.substr(a, 1);
            if(!bracketOperators[currentLayer].empty() && newOperator != bracketOperators[currentLayer])
            {
                throw std::string("Please only use one operator per bracket at the moment");
            }

            bracketOperators[currentLayer] = newOperator;
            returnValue.erase(returnValue.size()-newOperator.size(), newOperator.size());
        }

        //Else, store current character. Not important.
        else
        {
            returnValue += data[a];
        }
    }
    return returnValue;
}